

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChRotUtils.h
# Opt level: O1

ChMatrix33<double> *
chrono::fea::rotutils::Rot(ChMatrix33<double> *__return_storage_ptr__,ChVector<double> *phi)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  ActualDstType actualDst;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  double coeff [2];
  double local_28;
  double local_20;
  
  RotCo<chrono::ChVector<double>,double>(2,phi,phi,&local_28);
  dVar1 = phi->m_data[0];
  auVar7._8_8_ = 0;
  auVar7._0_8_ = dVar1;
  dVar2 = phi->m_data[1];
  auVar9._8_8_ = 0;
  auVar9._0_8_ = dVar2;
  dVar3 = phi->m_data[2];
  auVar17._8_8_ = 0;
  auVar17._0_8_ = dVar3;
  auVar11._8_8_ = 0;
  auVar11._0_8_ = local_28 * dVar3;
  auVar16._8_8_ = 0;
  auVar16._0_8_ = local_28 * dVar2;
  auVar8 = vunpcklpd_avx(auVar16,auVar11);
  auVar6._8_8_ = 0x8000000000000000;
  auVar6._0_8_ = 0x8000000000000000;
  auVar6 = vxorpd_avx512vl(auVar16,auVar6);
  auVar15._8_8_ = 0;
  auVar15._0_8_ = local_28 * dVar1;
  auVar6 = vunpcklpd_avx(auVar6,auVar15);
  dVar4 = dVar1 * local_20;
  dVar5 = dVar2 * local_20;
  local_20 = dVar3 * local_20;
  auVar20._8_8_ = 0;
  auVar20._0_8_ = dVar5;
  auVar21._8_8_ = 0;
  auVar21._0_8_ = local_20 * dVar3;
  auVar9 = vfnmsub231sd_fma(auVar21,auVar9,auVar20);
  auVar25._8_8_ = 0;
  auVar25._0_8_ = dVar4 * dVar2;
  auVar9 = vunpcklpd_avx(auVar9,auVar25);
  auVar13._8_8_ = 0;
  auVar13._0_8_ = local_20;
  auVar26._8_8_ = 0;
  auVar26._0_8_ = dVar4 * dVar1;
  auVar15 = vfnmsub231sd_fma(auVar26,auVar17,auVar13);
  auVar14._8_8_ = 0;
  auVar14._0_8_ = dVar2 * local_20;
  auVar23._8_8_ = 0;
  auVar23._0_8_ = dVar1 * local_20;
  auVar11 = vunpcklpd_avx(auVar23,auVar14);
  auVar22._8_8_ = 0;
  auVar22._0_8_ = dVar5 * dVar1;
  auVar24._8_8_ = 0;
  auVar24._0_8_ = dVar4 * dVar3;
  auVar13 = vunpcklpd_avx(auVar24,auVar22);
  auVar18._8_8_ = 0;
  auVar18._0_8_ = dVar5 * dVar3;
  auVar15 = vunpcklpd_avx(auVar15,auVar18);
  auVar10._8_8_ = 0;
  auVar10._0_8_ = dVar5 * dVar2;
  auVar19._8_8_ = 0;
  auVar19._0_8_ = dVar4;
  auVar10 = vfnmsub231sd_fma(auVar10,auVar7,auVar19);
  auVar12._8_8_ = 0;
  auVar12._0_8_ = 0.0 - local_28 * dVar3;
  auVar7 = vunpcklpd_avx(ZEXT816(0x3ff0000000000000),auVar12);
  (__return_storage_ptr__->super_Matrix<double,_3,_3,_1,_3,_3>).
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0] =
       auVar9._0_8_ + auVar7._0_8_;
  (__return_storage_ptr__->super_Matrix<double,_3,_3,_1,_3,_3>).
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1] =
       auVar9._8_8_ + auVar7._8_8_;
  (__return_storage_ptr__->super_Matrix<double,_3,_3,_1,_3,_3>).
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2] =
       auVar13._0_8_ + auVar8._0_8_ + 0.0;
  (__return_storage_ptr__->super_Matrix<double,_3,_3,_1,_3,_3>).
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3] =
       auVar13._8_8_ + auVar8._8_8_ + 0.0;
  auVar8._8_8_ = 0;
  auVar8._0_8_ = 0.0 - local_28 * dVar1;
  auVar8 = vunpcklpd_avx(ZEXT816(0x3ff0000000000000),auVar8);
  (__return_storage_ptr__->super_Matrix<double,_3,_3,_1,_3,_3>).
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[4] =
       auVar8._0_8_ + auVar15._0_8_;
  (__return_storage_ptr__->super_Matrix<double,_3,_3,_1,_3,_3>).
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[5] =
       auVar8._8_8_ + auVar15._8_8_;
  (__return_storage_ptr__->super_Matrix<double,_3,_3,_1,_3,_3>).
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[6] =
       auVar6._0_8_ + 0.0 + auVar11._0_8_;
  (__return_storage_ptr__->super_Matrix<double,_3,_3,_1,_3,_3>).
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[7] =
       auVar6._8_8_ + 0.0 + auVar11._8_8_;
  (__return_storage_ptr__->super_Matrix<double,_3,_3,_1,_3,_3>).
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8] =
       auVar10._0_8_ + 1.0;
  return __return_storage_ptr__;
}

Assistant:

ChMatrix33<> Rot(const ChVector<>& phi) {
    double coeff[COEFF_B];

    CoeffB(phi, phi, coeff);

    ChMatrix33<> Eye(1);
    ChStarMatrix33<> Phix(phi * coeff[0]);
    ChStarMatrix33<> pxpx(phi, phi * coeff[1]);

    return Eye + Phix + pxpx; // I + c[0] * phi x + c[1] * phi x phi x
}